

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalStructInference.cpp
# Opt level: O1

void __thiscall
wasm::anon_unknown_226::GlobalStructInference::run(GlobalStructInference *this,Module *module)

{
  __node_base_ptr *__dest;
  size_t *this_00;
  Expression *pEVar1;
  Global *pGVar2;
  long *plVar3;
  iterator iVar4;
  _Hash_node_base *p_Var5;
  _Hash_node_base *p_Var6;
  long lVar7;
  char *pcVar8;
  __alloc_node_gen_t _Var9;
  bool bVar10;
  _Base_ptr p_Var11;
  size_type sVar12;
  const_iterator cVar13;
  vector<wasm::Name,std::allocator<wasm::Name>> *pvVar14;
  ulong uVar15;
  HeapType HVar16;
  _Base_ptr p_Var17;
  pointer puVar18;
  undefined1 auVar19 [8];
  long *plVar20;
  _Hash_node_base *p_Var21;
  optional<wasm::HeapType> oVar22;
  undefined1 auStack_2e8 [8];
  __alloc_node_gen_t __alloc_node_gen;
  _Alloc_hider local_2d8;
  undefined1 local_158 [8];
  ParallelFunctionAnalysis<std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
  analysis;
  unordered_map<wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
  typeGlobalsCopy;
  undefined1 local_c8 [8];
  HeapTypes unoptimizable;
  HeapTypes unoptimizableCopy;
  _Storage<wasm::HeapType,_true> local_48;
  HeapType curr;
  
  if (((module->features).features & 0x400) != 0) {
    if ((((this->super_Pass).runner)->options).closedWorld == false) {
      Fatal::Fatal((Fatal *)auStack_2e8);
      Fatal::operator<<((Fatal *)auStack_2e8,(char (*) [28])"GSI requires --closed-world");
      Fatal::~Fatal((Fatal *)auStack_2e8);
    }
    typeGlobalsCopy._M_h._M_single_bucket = (__node_base_ptr)0x0;
    wasm::ModuleUtils::
    ParallelFunctionAnalysis<std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
    ::ParallelFunctionAnalysis
              ((ParallelFunctionAnalysis<std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
                *)local_158,module,(Func *)&typeGlobalsCopy._M_h._M_single_bucket);
    __dest = &typeGlobalsCopy._M_h._M_single_bucket;
    std::
    _Function_handler<void_(wasm::Function_*,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/GlobalStructInference.cpp:89:16)>
    ::_M_manager((_Any_data *)__dest,(_Any_data *)__dest,__destroy_functor);
    local_c8 = (undefined1  [8])&unoptimizable._M_h._M_rehash_policy._M_next_resize;
    unoptimizable._M_h._M_buckets = (__buckets_ptr)0x1;
    unoptimizable._M_h._M_bucket_count = 0;
    unoptimizable._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    unoptimizable._M_h._M_element_count._0_4_ = 0x3f800000;
    unoptimizable._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    unoptimizable._M_h._M_rehash_policy._4_4_ = 0;
    unoptimizable._M_h._M_rehash_policy._M_next_resize = 0;
    if (analysis.map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
        (_Base_ptr)&analysis.map) {
      p_Var11 = analysis.map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      do {
        for (p_Var17 = p_Var11[1]._M_right; p_Var17 != (_Base_ptr)0x0;
            p_Var17 = *(_Base_ptr *)p_Var17) {
          unoptimizable._M_h._M_single_bucket = (__node_base_ptr)p_Var17->_M_parent;
          auStack_2e8 = (undefined1  [8])local_c8;
          std::
          _Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_insert<wasm::HeapType_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::HeapType,true>>>>
                    ((_Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)local_c8,&unoptimizable._M_h._M_single_bucket,auStack_2e8);
        }
        p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
      } while (p_Var11 != (_Base_ptr)&analysis.map);
    }
    puVar18 = (module->globals).
              super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    HVar16.id = (uintptr_t)
                (module->globals).
                super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar18 != (pointer)HVar16.id) {
      this_00 = &analysis.map._M_t._M_impl.super__Rb_tree_header._M_node_count;
      curr.id = HVar16.id;
      do {
        if (*(char **)((long)&(((puVar18->_M_t).
                                super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                                .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl)->
                              super_Importable).module + 8) == (char *)0x0) {
          FindAll<wasm::StructNew>::FindAll
                    ((FindAll<wasm::StructNew> *)auStack_2e8,
                     ((puVar18->_M_t).
                      super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                      super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                      super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl)->init);
          _Var9 = __alloc_node_gen;
          for (auVar19 = auStack_2e8; auVar19 != (undefined1  [8])_Var9._M_h;
              auVar19 = (undefined1  [8])((long)auVar19 + 8)) {
            pEVar1 = *(Expression **)auVar19;
            analysis.map._M_t._M_impl.super__Rb_tree_header._M_node_count = (pEVar1->type).id;
            bVar10 = wasm::Type::isRef((Type *)this_00);
            if ((bVar10) &&
               (pEVar1 != ((puVar18->_M_t).
                           super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
                           _M_t.
                           super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                           .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl)->init)) {
              local_48._M_value = wasm::Type::getHeapType((Type *)this_00);
              unoptimizable._M_h._M_single_bucket = (__node_base_ptr)local_c8;
              std::
              _Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              ::
              _M_insert<wasm::HeapType,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::HeapType,true>>>>
                        ((_Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                          *)unoptimizable._M_h._M_single_bucket,&local_48,
                         &unoptimizable._M_h._M_single_bucket);
            }
          }
          if (auStack_2e8 != (undefined1  [8])0x0) {
            operator_delete((void *)auStack_2e8,(long)local_2d8._M_p - (long)auStack_2e8);
          }
          bVar10 = wasm::Type::isRef(&((puVar18->_M_t).
                                       super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                                       .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl)->
                                      init->type);
          HVar16 = curr;
          if (bVar10) {
            unoptimizable._M_h._M_single_bucket =
                 (__node_base_ptr)
                 wasm::Type::getHeapType
                           (&((puVar18->_M_t).
                              super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                              .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl)->init->
                             type);
            pGVar2 = (puVar18->_M_t).
                     super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                     super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                     super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
            if ((pGVar2->type).id == (pGVar2->init->type).id) {
              if (pGVar2->mutable_ == true) {
                auStack_2e8 = (undefined1  [8])local_c8;
                std::
                _Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                ::
                _M_insert<wasm::HeapType_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::HeapType,true>>>>
                          ((_Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                            *)auStack_2e8,&unoptimizable._M_h._M_single_bucket,auStack_2e8);
              }
              else if (pGVar2->init->_id == StructNewId) {
                pvVar14 = (vector<wasm::Name,std::allocator<wasm::Name>> *)
                          std::__detail::
                          _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                        *)&this->typeGlobals,
                                       (key_type *)&unoptimizable._M_h._M_single_bucket);
                pGVar2 = (puVar18->_M_t).
                         super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                         super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
                iVar4._M_current = *(Name **)(pvVar14 + 8);
                if (iVar4._M_current == *(Name **)(pvVar14 + 0x10)) {
                  std::vector<wasm::Name,std::allocator<wasm::Name>>::
                  _M_realloc_insert<wasm::Name_const&>(pvVar14,iVar4,(Name *)pGVar2);
                }
                else {
                  pcVar8 = *(char **)((long)&(pGVar2->super_Importable).super_Named + 8);
                  ((iVar4._M_current)->super_IString).str._M_len =
                       *(size_t *)&(pGVar2->super_Importable).super_Named;
                  ((iVar4._M_current)->super_IString).str._M_str = pcVar8;
                  *(long *)(pvVar14 + 8) = *(long *)(pvVar14 + 8) + 0x10;
                }
              }
            }
            else {
              auStack_2e8 = (undefined1  [8])local_c8;
              std::
              _Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              ::
              _M_insert<wasm::HeapType_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::HeapType,true>>>>
                        ((_Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                          *)auStack_2e8,&unoptimizable._M_h._M_single_bucket,auStack_2e8);
            }
          }
        }
        puVar18 = puVar18 + 1;
      } while (puVar18 != (pointer)HVar16.id);
    }
    auStack_2e8 = (undefined1  [8])&unoptimizable._M_h._M_single_bucket;
    unoptimizable._M_h._M_single_bucket = (__node_base_ptr)0x0;
    std::
    _Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_assign<std::_Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::HeapType,true>>>>
              ((_Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)auStack_2e8,
               (_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)local_c8,
               (_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::HeapType,_true>_>_> *)
               auStack_2e8);
    auStack_2e8 = (undefined1  [8])&analysis.map._M_t._M_impl.super__Rb_tree_header._M_node_count;
    analysis.map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    typeGlobalsCopy._M_h._M_buckets = (__buckets_ptr)(this->typeGlobals)._M_h._M_bucket_count;
    typeGlobalsCopy._M_h._M_bucket_count = 0;
    typeGlobalsCopy._M_h._M_before_begin._M_nxt =
         (_Hash_node_base *)(this->typeGlobals)._M_h._M_element_count;
    typeGlobalsCopy._M_h._M_element_count = *(size_type *)&(this->typeGlobals)._M_h._M_rehash_policy
    ;
    typeGlobalsCopy._M_h._M_rehash_policy._0_8_ =
         (this->typeGlobals)._M_h._M_rehash_policy._M_next_resize;
    typeGlobalsCopy._M_h._M_rehash_policy._M_next_resize = 0;
    std::
    _Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,std::vector<wasm::Name,std::allocator<wasm::Name>>>,std::allocator<std::pair<wasm::HeapType_const,std::vector<wasm::Name,std::allocator<wasm::Name>>>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign<std::_Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,std::vector<wasm::Name,std::allocator<wasm::Name>>>,std::allocator<std::pair<wasm::HeapType_const,std::vector<wasm::Name,std::allocator<wasm::Name>>>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<wasm::HeapType_const,std::vector<wasm::Name,std::allocator<wasm::Name>>>,true>>>>
              ((_Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,std::vector<wasm::Name,std::allocator<wasm::Name>>>,std::allocator<std::pair<wasm::HeapType_const,std::vector<wasm::Name,std::allocator<wasm::Name>>>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)auStack_2e8,&(this->typeGlobals)._M_h,
               (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_true>_>_>
                *)auStack_2e8);
    if (typeGlobalsCopy._M_h._M_bucket_count != 0) {
      sVar12 = typeGlobalsCopy._M_h._M_bucket_count;
      do {
        local_48 = *(_Storage<wasm::HeapType,_true> *)(sVar12 + 8);
        curr.id = sVar12;
        do {
          oVar22 = HeapType::getSuperType(&local_48._M_value);
          if (((undefined1  [16])
               oVar22.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) ==
              (undefined1  [16])0x0) break;
          local_48 = oVar22.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                     super__Optional_payload_base<wasm::HeapType>._M_payload;
          cVar13 = std::
                   _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   ::find((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                           *)local_c8,&local_48._M_value);
          if (cVar13.super__Node_iterator_base<wasm::HeapType,_true>._M_cur == (__node_type *)0x0) {
            plVar3 = *(long **)(curr.id + 0x18);
            for (plVar20 = *(long **)(curr.id + 0x10); plVar20 != plVar3; plVar20 = plVar20 + 2) {
              auStack_2e8 = (undefined1  [8])*plVar20;
              __alloc_node_gen._M_h = (__hashtable_alloc *)plVar20[1];
              pvVar14 = (vector<wasm::Name,std::allocator<wasm::Name>> *)
                        std::__detail::
                        _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)&this->typeGlobals,&local_48._M_value);
              iVar4._M_current = *(Name **)(pvVar14 + 8);
              if (iVar4._M_current == *(Name **)(pvVar14 + 0x10)) {
                std::vector<wasm::Name,std::allocator<wasm::Name>>::
                _M_realloc_insert<wasm::Name_const&>(pvVar14,iVar4,(Name *)auStack_2e8);
              }
              else {
                *(undefined4 *)&((iVar4._M_current)->super_IString).str._M_len = auStack_2e8._0_4_;
                *(undefined4 *)((long)&((iVar4._M_current)->super_IString).str._M_len + 4) =
                     auStack_2e8._4_4_;
                *(undefined4 *)&((iVar4._M_current)->super_IString).str._M_str =
                     __alloc_node_gen._M_h._0_4_;
                *(undefined4 *)((long)&((iVar4._M_current)->super_IString).str._M_str + 4) =
                     __alloc_node_gen._M_h._4_4_;
                *(long *)(pvVar14 + 8) = *(long *)(pvVar14 + 8) + 0x10;
              }
            }
          }
        } while (((undefined1  [16])
                  oVar22.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) !=
                 (undefined1  [16])0x0);
        sVar12 = *(size_type *)curr.id;
      } while (sVar12 != 0);
    }
    if ((this->typeGlobals)._M_h._M_element_count != 0) {
      for (p_Var21 = (this->typeGlobals)._M_h._M_before_begin._M_nxt;
          p_Var21 != (_Hash_node_base *)0x0; p_Var21 = p_Var21->_M_nxt) {
        p_Var5 = p_Var21[2]._M_nxt;
        p_Var6 = p_Var21[3]._M_nxt;
        if (p_Var5 != p_Var6) {
          uVar15 = (long)p_Var6 - (long)p_Var5 >> 4;
          lVar7 = 0x3f;
          if (uVar15 != 0) {
            for (; uVar15 >> lVar7 == 0; lVar7 = lVar7 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<wasm::Name*,std::vector<wasm::Name,std::allocator<wasm::Name>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (p_Var5,p_Var6,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<wasm::Name*,std::vector<wasm::Name,std::allocator<wasm::Name>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (p_Var5,p_Var6);
        }
      }
      auStack_2e8 = (undefined1  [8])&PTR__WalkerPass_00d88900;
      __alloc_node_gen._M_h = (__hashtable_alloc *)(this->super_Pass).runner;
      WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>::run
                ((WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                  *)auStack_2e8,module);
      auStack_2e8 = (undefined1  [8])&PTR__Pass_00d87048;
    }
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&analysis.map._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)&unoptimizable._M_h._M_single_bucket);
    std::
    _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_c8);
    std::
    _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>,_std::_Select1st<std::pair<wasm::Function_*const,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>,_std::_Select1st<std::pair<wasm::Function_*const,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>_>_>
                 *)&analysis);
  }
  return;
}

Assistant:

void run(Module* module) override {
    if (!module->features.hasGC()) {
      return;
    }

    if (!getPassOptions().closedWorld) {
      Fatal() << "GSI requires --closed-world";
    }

    // First, find all the information we need. We need to know which struct
    // types are created in functions, because we will not be able to optimize
    // those.

    using HeapTypes = std::unordered_set<HeapType>;

    ModuleUtils::ParallelFunctionAnalysis<HeapTypes> analysis(
      *module, [&](Function* func, HeapTypes& types) {
        if (func->imported()) {
          return;
        }

        for (auto* structNew : FindAll<StructNew>(func->body).list) {
          auto type = structNew->type;
          if (type.isRef()) {
            types.insert(type.getHeapType());
          }
        }
      });

    // We cannot optimize types that appear in a struct.new in a function, which
    // we just collected and merge now.
    HeapTypes unoptimizable;

    for (auto& [func, types] : analysis.map) {
      for (auto type : types) {
        unoptimizable.insert(type);
      }
    }

    // Process the globals.
    for (auto& global : module->globals) {
      if (global->imported()) {
        continue;
      }

      // We cannot optimize a type that appears in a non-toplevel location in a
      // global init.
      for (auto* structNew : FindAll<StructNew>(global->init).list) {
        auto type = structNew->type;
        if (type.isRef() && structNew != global->init) {
          unoptimizable.insert(type.getHeapType());
        }
      }

      if (!global->init->type.isRef()) {
        continue;
      }

      auto type = global->init->type.getHeapType();

      // The global's declared type must match the init's type. If not, say if
      // we had a global declared as type |any| but that contains (ref $A), then
      // that is not something we can optimize, as ref.eq on a global.get of
      // that global will not validate. (This should not be a problem after
      // GlobalSubtyping runs, which will specialize the type of the global.)
      if (global->type != global->init->type) {
        unoptimizable.insert(type);
        continue;
      }

      // We cannot optimize mutable globals.
      if (global->mutable_) {
        unoptimizable.insert(type);
        continue;
      }

      // Finally, if this is a struct.new then it is one we can optimize; note
      // it.
      if (global->init->is<StructNew>()) {
        typeGlobals[type].push_back(global->name);
      }
    }

    // A struct.get might also read from any of the subtypes. As a result, an
    // unoptimizable type makes all its supertypes unoptimizable as well.
    // TODO: this could be specific per field (and not all supers have all
    //       fields)
    // Iterate on a copy to avoid invalidation as we insert.
    auto unoptimizableCopy = unoptimizable;
    for (auto type : unoptimizableCopy) {
      while (1) {
        unoptimizable.insert(type);

        // Also erase the globals, as we will never read them anyhow. This can
        // allow us to skip unneeded work, when we check if typeGlobals is
        // empty, below.
        typeGlobals.erase(type);

        auto super = type.getSuperType();
        if (!super) {
          break;
        }
        type = *super;
      }
    }

    // Similarly, propagate global names: if one type has [global1], then a get
    // of any supertype might access that, so propagate to them.
    auto typeGlobalsCopy = typeGlobals;
    for (auto& [type, globals] : typeGlobalsCopy) {
      auto curr = type;
      while (1) {
        auto super = curr.getSuperType();
        if (!super) {
          break;
        }
        curr = *super;

        // As above, avoid adding pointless data for anything unoptimizable.
        if (!unoptimizable.count(curr)) {
          for (auto global : globals) {
            typeGlobals[curr].push_back(global);
          }
        }
      }
    }

    if (typeGlobals.empty()) {
      // We found nothing we can optimize.
      return;
    }

    // The above loop on typeGlobalsCopy is on an unsorted data structure, and
    // that can lead to nondeterminism in typeGlobals. Sort the vectors there to
    // ensure determinism.
    for (auto& [type, globals] : typeGlobals) {
      std::sort(globals.begin(), globals.end());
    }

    // Optimize based on the above.
    struct FunctionOptimizer
      : public WalkerPass<PostWalker<FunctionOptimizer>> {
      bool isFunctionParallel() override { return true; }

      std::unique_ptr<Pass> create() override {
        return std::make_unique<FunctionOptimizer>(parent);
      }

      FunctionOptimizer(GlobalStructInference& parent) : parent(parent) {}

      void visitStructGet(StructGet* curr) {
        auto type = curr->ref->type;
        if (type == Type::unreachable) {
          return;
        }

        // We must ignore the case of a non-struct heap type, that is, a bottom
        // type (which is all that is left after we've already ruled out
        // unreachable). Such things will not be in typeGlobals, which we are
        // checking now anyhow.
        auto heapType = type.getHeapType();
        auto iter = parent.typeGlobals.find(heapType);
        if (iter == parent.typeGlobals.end()) {
          return;
        }

        // This cannot be a bottom type as we found it in the typeGlobals map,
        // which only contains types of struct.news.
        assert(heapType.isStruct());

        // The field must be immutable.
        auto fieldIndex = curr->index;
        auto& field = heapType.getStruct().fields[fieldIndex];
        if (field.mutable_ == Mutable) {
          return;
        }

        const auto& globals = iter->second;
        if (globals.size() == 0) {
          return;
        }

        auto& wasm = *getModule();
        Builder builder(wasm);

        if (globals.size() == 1) {
          // Leave it to other passes to infer the constant value of the field,
          // if there is one: just change the reference to the global, which
          // will unlock those other optimizations. Note we must trap if the ref
          // is null, so add RefAsNonNull here.
          auto global = globals[0];
          curr->ref = builder.makeSequence(
            builder.makeDrop(builder.makeRefAs(RefAsNonNull, curr->ref)),
            builder.makeGlobalGet(global, wasm.getGlobal(globals[0])->type));
          return;
        }

        // We are looking for the case where we can pick between two values
        // using a single comparison. More than two values, or more than a
        // single comparison, add tradeoffs that may not be worth it, and a
        // single value (or no value) is already handled by other passes.
        //
        // That situation may involve more than two globals. For example we may
        // have three relevant globals, but two may have the same value. In that
        // case we can compare against the third:
        //
        //  $global0: (struct.new $Type (i32.const 42))
        //  $global1: (struct.new $Type (i32.const 42))
        //  $global2: (struct.new $Type (i32.const 1337))
        //
        // (struct.get $Type (ref))
        //   =>
        // (select
        //   (i32.const 1337)
        //   (i32.const 42)
        //   (ref.eq (ref) $global2))

        // Find the constant values and which globals correspond to them.
        // TODO: SmallVectors?
        std::vector<Literal> values;
        std::vector<std::vector<Name>> globalsForValue;

        // Check if the relevant fields contain constants.
        auto fieldType = field.type;
        for (Index i = 0; i < globals.size(); i++) {
          Name global = globals[i];
          auto* structNew = wasm.getGlobal(global)->init->cast<StructNew>();
          Literal value;
          if (structNew->isWithDefault()) {
            value = Literal::makeZero(fieldType);
          } else {
            auto* init = structNew->operands[fieldIndex];
            if (!Properties::isConstantExpression(init)) {
              // Non-constant; give up entirely.
              return;
            }
            value = Properties::getLiteral(init);
          }

          // Process the current value, comparing it against the previous.
          auto found = std::find(values.begin(), values.end(), value);
          if (found == values.end()) {
            // This is a new value.
            assert(values.size() <= 2);
            if (values.size() == 2) {
              // Adding this value would mean we have too many, so give up.
              return;
            }
            values.push_back(value);
            globalsForValue.push_back({global});
          } else {
            // This is an existing value.
            Index index = found - values.begin();
            globalsForValue[index].push_back(global);
          }
        }

        // We have some globals (at least 2), and so must have at least one
        // value. And we have already exited if we have more than 2 values (see
        // the early return above) so that only leaves 1 and 2.
        if (values.size() == 1) {
          // The case of 1 value is simple: trap if the ref is null, and
          // otherwise return the value.
          replaceCurrent(builder.makeSequence(
            builder.makeDrop(builder.makeRefAs(RefAsNonNull, curr->ref)),
            builder.makeConstantExpression(values[0])));
          return;
        }
        assert(values.size() == 2);

        // We have two values. Check that we can pick between them using a
        // single comparison. While doing so, ensure that the index we can check
        // on is 0, that is, the first value has a single global.
        if (globalsForValue[0].size() == 1) {
          // The checked global is already in index 0.
        } else if (globalsForValue[1].size() == 1) {
          std::swap(values[0], values[1]);
          std::swap(globalsForValue[0], globalsForValue[1]);
        } else {
          // Both indexes have more than one option, so we'd need more than one
          // comparison. Give up.
          return;
        }

        // Excellent, we can optimize here! Emit a select.
        //
        // Note that we must trap on null, so add a ref.as_non_null here.
        auto checkGlobal = globalsForValue[0][0];
        replaceCurrent(builder.makeSelect(
          builder.makeRefEq(builder.makeRefAs(RefAsNonNull, curr->ref),
                            builder.makeGlobalGet(
                              checkGlobal, wasm.getGlobal(checkGlobal)->type)),
          builder.makeConstantExpression(values[0]),
          builder.makeConstantExpression(values[1])));
      }

    private:
      GlobalStructInference& parent;
    };

    FunctionOptimizer(*this).run(getPassRunner(), module);
  }